

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall Thread::start(Thread *this)

{
  int iVar1;
  ThreadData *this_00;
  void *__stat_loc;
  ThreadData *data;
  Thread *this_local;
  
  if (((this->started_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!started_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/Thread.cpp"
                  ,0x54,"void Thread::start()");
  }
  this->started_ = true;
  this_00 = (ThreadData *)operator_new(0x50);
  ThreadData::ThreadData(this_00,&this->func_,&this->name_,&this->tid_,&this->latch_);
  __stat_loc = (void *)0x0;
  iVar1 = pthread_create(&this->pthreadId_,(pthread_attr_t *)0x0,startThread,this_00);
  if (iVar1 == 0) {
    CountDownLatch::wait(&this->latch_,__stat_loc);
    if (this->tid_ < 1) {
      __assert_fail("tid_ > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/Thread.cpp"
                    ,0x5c,"void Thread::start()");
    }
  }
  else {
    this->started_ = false;
    if (this_00 != (ThreadData *)0x0) {
      ThreadData::~ThreadData(this_00);
      operator_delete(this_00);
    }
  }
  return;
}

Assistant:

void Thread::start() {
    assert(!started_);
    started_ = true;
    ThreadData* data = new ThreadData(func_, name_, &tid_, &latch_);
    if(pthread_create(&pthreadId_, NULL, &startThread, data)) {
        started_ = false;
        delete data;
    } else {
        latch_.wait();
        assert(tid_ > 0);
    }
}